

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear
          (QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this)

{
  QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (pQVar1 == (QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                 *)0x0) {
    return;
  }
  if ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value == (__atomic_base<int>)0x1) {
    std::
    _Rb_tree<int,_std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>,_std::_Select1st<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>
    ::clear(&(pQVar1->m)._M_t);
    return;
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>_>
  ::reset(&this->d,(QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                    *)0x0);
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }